

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall QScrollerPrivate::recalcScrollingSegments(QScrollerPrivate *this,bool forceRecalc)

{
  long lVar1;
  bool bVar2;
  byte in_SIL;
  QScrollerPrivate *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar3;
  QPointF *unaff_retaddr;
  QScroller *in_stack_00000008;
  QPointF *in_stack_00000010;
  QScroller *q;
  QPointF ppm;
  undefined1 in_stack_ffffffffffffffc8 [16];
  QScroller *this_00;
  Orientation orientation;
  QScrollerPrivate *this_01;
  qreal local_20;
  
  this_00 = in_stack_ffffffffffffffc8._12_8_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  orientation = (Orientation)((ulong)this_00 >> 0x20);
  QScroller::pixelPerMeter(this_00);
  QVar3 = QScroller::velocity(in_stack_00000008);
  this_01 = (QScrollerPrivate *)QVar3.xp;
  (in_RDI->releaseVelocity).xp = (qreal)this_01;
  local_20 = QVar3.yp;
  (in_RDI->releaseVelocity).yp = local_20;
  if ((((in_SIL & 1) != 0) || (bVar2 = scrollingSegmentsValid(this_01,orientation), !bVar2)) ||
     (bVar2 = scrollingSegmentsValid(this_01,orientation), !bVar2)) {
    ::operator+((QPointF *)in_RDI,&in_RDI->releaseVelocity);
    createScrollingSegments
              ((QScrollerPrivate *)q,in_stack_00000010,(QPointF *)in_stack_00000008,unaff_retaddr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollerPrivate::recalcScrollingSegments(bool forceRecalc)
{
    Q_Q(QScroller);
    QPointF ppm = q->pixelPerMeter();

    releaseVelocity = q->velocity();

    if (forceRecalc ||
        !scrollingSegmentsValid(Qt::Horizontal) ||
        !scrollingSegmentsValid(Qt::Vertical))
        createScrollingSegments(releaseVelocity, contentPosition + overshootPosition, ppm);
}